

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::GridMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  char *pcVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  size_t t;
  ulong uVar16;
  BufferView<embree::Vec3fa> *pBVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar20;
  size_t y_1;
  ulong uVar21;
  unsigned_long uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar28;
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  undefined1 auVar31 [16];
  ulong local_90;
  size_t local_88;
  size_t local_80;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar9 = _DAT_01f45a40;
  auVar8 = _DAT_01f45a30;
  uVar22 = r->_begin;
  local_88 = 0;
  auVar23 = _DAT_01f45a40;
  auVar24 = _DAT_01f45a30;
  auVar25 = _DAT_01f45a40;
  auVar26 = _DAT_01f45a30;
  local_80 = k;
  do {
    if (r->_end <= uVar22) {
      *(undefined1 (*) [16])
       (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
       field_0.m128 = auVar26;
      *(undefined1 (*) [16])
       (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
       field_0.m128 = auVar25;
      *(undefined1 (*) [16])
       (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
       field_0.m128 = auVar24;
      *(undefined1 (*) [16])
       (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
       field_0.m128 = auVar23;
      __return_storage_ptr__->end = local_88;
      return __return_storage_ptr__;
    }
    if (uVar22 < *(ulong *)&(this->super_GridMesh).field_0x70) {
      lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
      uVar18 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
      lVar15 = *(long *)&(this->super_GridMesh).field_0x68 * uVar22;
      uVar13 = (ulong)*(uint *)(lVar4 + lVar15);
      if (uVar13 < uVar18) {
        uVar2 = *(ushort *)(lVar4 + 10 + lVar15);
        uVar16 = (ulong)uVar2;
        uVar12 = *(uint *)(lVar4 + 4 + lVar15);
        uVar3 = *(ushort *)(lVar4 + 8 + lVar15);
        local_90 = (ulong)uVar3;
        if (((uint)uVar3 + uVar12 * (uVar2 - 1) + *(uint *)(lVar4 + lVar15)) - 1 < uVar18) {
          pBVar17 = (this->super_GridMesh).vertices.items;
          for (uVar18 = 0; uVar19 = uVar13, uVar21 = local_90, uVar18 != uVar16; uVar18 = uVar18 + 1
              ) {
            while (uVar21 != 0) {
              pcVar5 = (pBVar17->super_RawBufferView).ptr_ofs;
              pfVar1 = (float *)(pcVar5 + (pBVar17->super_RawBufferView).stride * uVar19);
              auVar27._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar27._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar27._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar27._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar20 = movmskps((int)pcVar5,auVar27);
              uVar19 = uVar19 + 1;
              uVar21 = uVar21 - 1;
              if ((~(byte)uVar20 & 7) != 0) goto LAB_00256307;
            }
            uVar13 = uVar13 + uVar12;
          }
          uVar18 = 0;
LAB_00256327:
          uVar12 = (uint)uVar18;
          if (uVar12 < (int)uVar16 - 1U) {
            uVar10 = 0;
            do {
              uVar11 = uVar10;
LAB_00256359:
              if ((ushort)local_90 - 1 <= uVar11) {
                uVar16 = (ulong)*(ushort *)(lVar4 + 10 + lVar15);
                uVar18 = (ulong)(uVar12 + 2);
                goto LAB_00256327;
              }
              uVar13 = (ulong)uVar11 + 3;
              if (local_90 <= uVar13) {
                uVar13 = local_90;
              }
              auVar27 = auVar8;
              auVar29 = auVar9;
              for (uVar16 = 0; uVar16 != (this->super_GridMesh).super_Geometry.numTimeSteps;
                  uVar16 = uVar16 + 1) {
                uVar19 = (ulong)*(ushort *)(lVar4 + 10 + lVar15);
                if (uVar18 + 3 < uVar19) {
                  uVar19 = uVar18 + 3;
                }
                pBVar17 = (this->super_GridMesh).vertices.items + uVar16;
                for (uVar21 = uVar18; uVar14 = (ulong)uVar11, uVar21 < uVar19; uVar21 = uVar21 + 1)
                {
                  for (; uVar14 < uVar13; uVar14 = uVar14 + 1) {
                    pcVar5 = (pBVar17->super_RawBufferView).ptr_ofs;
                    auVar31 = *(undefined1 (*) [16])
                               (pcVar5 + (*(uint *)(lVar4 + lVar15) + uVar14 +
                                         *(uint *)(lVar4 + 4 + lVar15) * uVar21) *
                                         (pBVar17->super_RawBufferView).stride);
                    auVar7._4_4_ = -(uint)(auVar31._4_4_ < 1.844e+18 && -1.844e+18 < auVar31._4_4_);
                    auVar7._0_4_ = -(uint)(auVar31._0_4_ < 1.844e+18 && -1.844e+18 < auVar31._0_4_);
                    auVar7._8_4_ = -(uint)(auVar31._8_4_ < 1.844e+18 && -1.844e+18 < auVar31._8_4_);
                    auVar7._12_4_ =
                         -(uint)(auVar31._12_4_ < 1.844e+18 && -1.844e+18 < auVar31._12_4_);
                    uVar20 = movmskps((int)pcVar5,auVar7);
                    if ((~(byte)uVar20 & 7) != 0) {
                      uVar11 = uVar11 + 2;
                      goto LAB_00256359;
                    }
                    auVar27 = minps(auVar27,auVar31);
                    auVar29 = maxps(auVar29,auVar31);
                  }
                }
              }
              aVar28._0_12_ = auVar27._0_12_;
              aVar28.m128[3] = (float)geomID;
              aVar30._0_12_ = auVar29._0_12_;
              aVar30.m128[3] = (float)local_80;
              auVar26 = minps(auVar26,(undefined1  [16])aVar28);
              auVar25 = maxps(auVar25,(undefined1  [16])aVar30);
              auVar31._0_4_ = auVar27._0_4_ + auVar29._0_4_;
              auVar31._4_4_ = auVar27._4_4_ + auVar29._4_4_;
              auVar31._8_4_ = auVar27._8_4_ + auVar29._8_4_;
              auVar31._12_4_ = (float)geomID + (float)local_80;
              auVar24 = minps(auVar24,auVar31);
              auVar23 = maxps(auVar23,auVar31);
              local_88 = local_88 + 1;
              uVar10 = uVar11 + 2;
              sgrids->items[local_80] =
                   (SubGridBuildData)
                   ((ulong)(uVar11 & 0xfffe | (uint)((ushort)local_90 <= uVar10) << 0xf) |
                    uVar22 << 0x20 |
                   (ulong)(uVar12 << 0x10 |
                          (uint)((uint)*(ushort *)(lVar4 + 10 + lVar15) <= uVar12 + 2) << 0x1f));
              pPVar6 = prims->items;
              pPVar6[local_80].lower.field_0 = aVar28;
              pPVar6[local_80].upper.field_0 = aVar30;
              local_90 = (ulong)*(ushort *)(lVar4 + 8 + lVar15);
              local_80 = local_80 + 1;
            } while( true );
          }
        }
      }
    }
LAB_00256307:
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids, const range<size_t>& r, size_t k, unsigned int geomID) const override 
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j)) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              BBox3fa bounds = empty;
              if (!buildBounds(g,x,y,bounds)) continue; // get bounds of subgrid
              const PrimRef prim(bounds,(unsigned)geomID,(unsigned)k);
              pinfo.add_center2(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;                
            }
          }
        }
        return pinfo;
      }